

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_5f564::DepsLogTestTruncated::Run(DepsLogTestTruncated *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LoadStatus LVar5;
  Node *pNVar6;
  pointer ppDVar7;
  size_t size;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  int local_280;
  allocator<char> local_279;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  ulong local_250;
  string local_248;
  string err;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  pointer local_1f8;
  pointer ppNStack_1f0;
  pointer local_1e8;
  pointer ppDStack_1e0;
  pointer local_1d8;
  pointer ppDStack_1d0;
  stat st;
  State state;
  
  State::State(&state);
  pTVar1 = g_current_test;
  st.st_nlink = (__nlink_t)&st.st_gid;
  st.st_dev._0_1_ = 0;
  st.st_ino = 0;
  st.st_mode = 0;
  st.st_uid = 0;
  st.st_gid._0_1_ = 0;
  st.st_size = 0;
  st.st_blksize = 0;
  st.st_blocks = 0;
  st.st_atim.tv_sec = 0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  st.st_atim.tv_nsec = 0;
  st.st_mtim.tv_sec = 0;
  err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deps,"DepsLogTest-tempfile",(allocator<char> *)&local_248);
  bVar2 = DepsLog::OpenForWrite((DepsLog *)&st,(string *)&deps,&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x168,"log.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&deps);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&err);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x169,"\"\" == err");
  if (bVar2) {
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    path.len_ = 5;
    path.str_ = "foo.h";
    local_248._M_dataplus._M_p = (pointer)State::GetNode(&state,path,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&local_248);
    path_00.len_ = 5;
    path_00.str_ = "bar.h";
    local_248._M_dataplus._M_p = (pointer)State::GetNode(&state,path_00,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&local_248);
    path_01.len_ = 5;
    path_01.str_ = "out.o";
    pNVar6 = State::GetNode(&state,path_01,0);
    DepsLog::RecordDeps((DepsLog *)&st,pNVar6,1,&deps);
    if (deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    path_02.len_ = 5;
    path_02.str_ = "foo.h";
    local_248._M_dataplus._M_p = (pointer)State::GetNode(&state,path_02,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&local_248);
    path_03.len_ = 6;
    path_03.str_ = "bar2.h";
    local_248._M_dataplus._M_p = (pointer)State::GetNode(&state,path_03,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&local_248);
    path_04.len_ = 6;
    path_04.str_ = "out2.o";
    pNVar6 = State::GetNode(&state,path_04,0);
    DepsLog::RecordDeps((DepsLog *)&st,pNVar6,2,&deps);
    DepsLog::Close((DepsLog *)&st);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog((DepsLog *)&st);
  State::~State(&state);
  pTVar1 = g_current_test;
  if (bVar2) {
    iVar4 = stat("DepsLogTest-tempfile",(stat *)&st);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x17a,"0 == stat(kTestFilename, &st)");
    if (bVar2) {
      size = st.st_size & 0xffffffff;
      local_280 = 2;
      local_250 = 5;
      do {
        pTVar1 = g_current_test;
        if ((int)size < 1) {
          return;
        }
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((ulong)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&state,"DepsLogTest-tempfile",(allocator<char> *)&err);
        bVar2 = Truncate((string *)&state,size,(string *)&deps);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0x183,"Truncate(kTestFilename, size, &err)");
        std::__cxx11::string::~string((string *)&state);
        if (bVar2) {
          State::State(&state);
          pTVar1 = g_current_test;
          err._M_dataplus._M_p = err._M_dataplus._M_p & 0xffffffffffffff00;
          err._M_string_length = 0;
          err.field_2._M_allocated_capacity = (size_type)&local_208;
          err.field_2._8_8_ = 0;
          local_208._M_local_buf[0] = '\0';
          local_1d8 = (pointer)0x0;
          ppDStack_1d0 = (pointer)0x0;
          local_1e8 = (pointer)0x0;
          ppDStack_1e0 = (pointer)0x0;
          local_1f8 = (pointer)0x0;
          ppNStack_1f0 = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"DepsLogTest-tempfile",&local_279);
          LVar5 = DepsLog::Load((DepsLog *)&err,&local_248,&state,(string *)&deps);
          testing::Test::Check
                    (pTVar1,LVar5 != LOAD_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x187,"log.Load(kTestFilename, &state, &err)");
          std::__cxx11::string::~string((string *)&local_248);
          if (deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish == (pointer)0x0) {
            bVar2 = testing::Test::Check
                              (g_current_test,
                               (int)((ulong)((long)ppNStack_1f0 - (long)local_1f8) >> 3) <=
                               (int)local_250,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0x18d,"node_count >= (int)log.nodes().size()");
            if (!bVar2) {
LAB_001467de:
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
              goto LAB_001467eb;
            }
            local_250 = (ulong)((long)ppNStack_1f0 - (long)local_1f8) >> 3;
            iVar4 = 0;
            for (ppDVar7 = ppDStack_1e0; ppDVar7 != local_1d8; ppDVar7 = ppDVar7 + 1) {
              iVar4 = (iVar4 + 1) - (uint)(*ppDVar7 == (Deps *)0x0);
            }
            bVar3 = testing::Test::Check
                              (g_current_test,iVar4 <= local_280,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0x197,"deps_count >= new_deps_count");
            bVar2 = true;
            if (!bVar3) goto LAB_001467de;
          }
          else {
LAB_001467eb:
            bVar2 = false;
            iVar4 = local_280;
          }
          DepsLog::~DepsLog((DepsLog *)&err);
          State::~State(&state);
          local_280 = iVar4;
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&deps);
        size = size - 1;
      } while (bVar2);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, Truncated) {
  // Create a file with some entries.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

    log.Close();
  }

  // Get the file size.
  struct stat st;
  ASSERT_EQ(0, stat(kTestFilename, &st));

  // Try reloading at truncated sizes.
  // Track how many nodes/deps were found; they should decrease with
  // smaller sizes.
  int node_count = 5;
  int deps_count = 2;
  for (int size = (int)st.st_size; size > 0; --size) {
    string err;
    ASSERT_TRUE(Truncate(kTestFilename, size, &err));

    State state;
    DepsLog log;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));
    if (!err.empty()) {
      // At some point the log will be so short as to be unparseable.
      break;
    }

    ASSERT_GE(node_count, (int)log.nodes().size());
    node_count = log.nodes().size();

    // Count how many non-NULL deps entries there are.
    int new_deps_count = 0;
    for (vector<DepsLog::Deps*>::const_iterator i = log.deps().begin();
         i != log.deps().end(); ++i) {
      if (*i)
        ++new_deps_count;
    }
    ASSERT_GE(deps_count, new_deps_count);
    deps_count = new_deps_count;
  }
}